

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

void __thiscall mp::PLPoints::PLPoints(PLPoints *this,PLSlopes *pls)

{
  size_type __new_size;
  double dVar1;
  pointer pdVar2;
  double *pdVar3;
  size_t __n;
  long lVar4;
  longdouble *plVar5;
  long lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  SmallVec<long_double,_32> YL;
  alloc_ty local_2b1;
  double local_2b0;
  double local_2a8;
  pointer local_2a0;
  pointer local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  small_vector_base<std::allocator<long_double>,_32U> local_258;
  
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_298 = (pls->slopes_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2a0 = (pls->slopes_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  lVar4 = (long)local_2a0 - (long)local_298;
  lVar6 = lVar4 >> 3;
  local_2b0 = pls->X0_;
  local_2a8 = pls->Y0_;
  __new_size = lVar6 + 1;
  std::vector<double,_std::allocator<double>_>::resize(&this->x_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->y_,__new_size);
  gch::detail::small_vector_base<std::allocator<long_double>,_32U>::small_vector_base
            (&local_258,__new_size,&local_2b1);
  pdVar2 = (pls->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)(pls->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar2;
  if (__n != 0) {
    memmove((this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + 1,pdVar2,__n);
  }
  pdVar3 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar3 = pdVar3[1] + -1.0;
  *(double *)((long)pdVar3 + lVar4) = pdVar3[lVar6 + -1] + 1.0;
  dVar1 = *pdVar3;
  uVar11 = SUB84(dVar1,0);
  uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
  lVar7 = (longdouble)0;
  if (local_2b0 < dVar1) {
    local_268 = local_2b0;
    local_270 = local_2a8;
    lVar7 = ((longdouble)dVar1 - (longdouble)local_2b0) *
            (longdouble)
            *(pls->slopes_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + (longdouble)local_2a8;
    local_260 = dVar1;
  }
  if (local_2a0 != local_298) {
    pdVar2 = (pls->slopes_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_278 = local_2a8;
    local_280 = local_2b0;
    lVar4 = 0;
    lVar8 = *local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>.m_data_ptr;
    plVar5 = local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>.m_data_ptr;
    do {
      plVar5 = plVar5 + 1;
      local_288 = (double)CONCAT44(uVar12,uVar11);
      lVar9 = (longdouble)pdVar2[lVar4];
      local_290 = pdVar3[lVar4 + 1];
      uVar11 = SUB84(local_290,0);
      uVar12 = (undefined4)((ulong)local_290 >> 0x20);
      lVar10 = ((longdouble)local_290 - (longdouble)local_288) * lVar9 + lVar8;
      *plVar5 = lVar10;
      if ((local_288 <= local_2b0) && ((lVar6 + -1 == lVar4 || (local_2b0 <= local_290)))) {
        lVar7 = (longdouble)local_2a8 -
                (lVar8 + (-(longdouble)local_288 - (longdouble)local_2b0) * lVar9);
      }
      lVar4 = lVar4 + 1;
      lVar8 = lVar10;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar4);
  }
  pdVar2 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = __new_size + (__new_size == 0);
  lVar4 = 0;
  do {
    *(double *)((long)pdVar2 + lVar4) =
         (double)(*(longdouble *)
                   ((long)local_258.m_data.
                          super_small_vector_data_base<long_double_*,_unsigned_long>.m_data_ptr +
                   lVar4 * 2) + lVar7);
    lVar4 = lVar4 + 8;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  if (0x20 < local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>.m_capacity)
  {
    operator_delete(local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>.
                    m_data_ptr,
                    local_258.m_data.super_small_vector_data_base<long_double_*,_unsigned_long>.
                    m_capacity << 4);
  }
  return;
}

Assistant:

PLPoints::PLPoints(const PLSlopes &pls) {
  constexpr auto eps = 1.0;           // works?
  const auto& bp = pls.GetBP();
  const auto& sl = pls.GetSlopes();
  const auto nsl = sl.size();
  const auto X0 = pls.GetX0(), Y0 = pls.GetY0();
  x_.resize(nsl+1);
  y_.resize(nsl+1);
  SmallVec<long double, 32> YL(nsl+1);   // leftmost point: YL[0]=0
  /// Copy and add dummy breakpoints on both ends
  std::copy(bp.begin(), bp.end(), x_.begin()+1);
  x_[0] = x_[1] - eps;
  x_[nsl] = x_[nsl-1] + eps;
  /// Lift the line by this
  long double deltaH {};
  if (x_[0] > X0)                     // if left x > reference point
    deltaH = ((long double)sl[0])
                 * ((long double)x_[0]-X0) + Y0;
  for (size_t i = 0; i < nsl; ++i) {
    assert( x_[i+1] > x_[i] );
    YL[i+1] = YL[i] + sl[i] * ((long double)x_[i+1]-x_[i]);
    if (x_[i]<=X0 && (x_[i+1]>=X0 || i==nsl-1))
      deltaH = Y0 - (YL[i] + sl[i]*(-(long double)x_[i]-X0));
  }
  for (size_t i = 0; i <= nsl; ++i) {
    y_[i] = YL[i] + deltaH;
  }
}